

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_column_writer.cpp
# Opt level: O1

unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>,_true>
__thiscall
duckdb::EnumColumnWriter::InitializePageState
          (EnumColumnWriter *this,PrimitiveColumnWriterState *state,idx_t page_idx)

{
  int iVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)operator_new(0x830);
  iVar1 = *(int *)((long)&(state->super_ColumnWriterState).repetition_levels.
                          super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  *puVar2 = &PTR__ColumnWriterPageState_024c8f08;
  *(int *)(puVar2 + 1) = iVar1;
  *(uint *)((long)puVar2 + 0xc) = iVar1 + 7U >> 3;
  *(undefined1 *)(puVar2 + 0x105) = 0;
  switchD_0105dc25::default(puVar2 + 4,0,0x800);
  *(undefined8 **)this = puVar2;
  return (unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
          )(unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
            )this;
}

Assistant:

unique_ptr<ColumnWriterPageState> EnumColumnWriter::InitializePageState(PrimitiveColumnWriterState &state,
                                                                        idx_t page_idx) {
	return make_uniq<EnumWriterPageState>(bit_width);
}